

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::NodeLoader::end__instance_geometry(NodeLoader *this)

{
  IFilePartLoader::
  copyStlContainerToArray<std::set<COLLADAFW::MaterialBinding,std::less<COLLADAFW::MaterialBinding>,std::allocator<COLLADAFW::MaterialBinding>>,COLLADAFW::Array<COLLADAFW::MaterialBinding>>
            (&this->mCurrentMaterialBindings,&this->mCurrentInstanceGeometry->mMaterialBindings);
  this->mCurrentInstanceGeometry = (InstanceGeometry *)0x0;
  this->mCurrentMaterialInfo = (GeometryMaterialIdInfo *)0x0;
  std::
  _Rb_tree<COLLADAFW::MaterialBinding,_COLLADAFW::MaterialBinding,_std::_Identity<COLLADAFW::MaterialBinding>,_std::less<COLLADAFW::MaterialBinding>,_std::allocator<COLLADAFW::MaterialBinding>_>
  ::clear(&(this->mCurrentMaterialBindings)._M_t);
  return true;
}

Assistant:

bool NodeLoader::end__instance_geometry()
	{
        FilePartLoader::copyStlContainerToArray( mCurrentMaterialBindings, mCurrentInstanceGeometry->getMaterialBindings());
        mCurrentInstanceGeometry = 0;
        endInstanceWithMaterial();

        return true;
	}